

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

Status __thiscall
leveldb::anon_unknown_1::PosixWritableFile::SyncFd
          (PosixWritableFile *this,int fd,string *fd_path,bool syncing_dir)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = fdatasync(fd);
  if ((iVar2 == 0) || ((syncing_dir && (piVar3 = __errno_location(), *piVar3 == 0x16)))) {
    (this->super_WritableFile)._vptr_WritableFile = (_func_int **)0x0;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return (Status)(char *)this;
    }
  }
  else {
    piVar3 = __errno_location();
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      PosixError((anon_unknown_1 *)this,fd_path,*piVar3);
      return (Status)(char *)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

static Status SyncFd(int fd, const std::string& fd_path, bool syncing_dir) {
#if HAVE_FULLFSYNC
    // On macOS and iOS, fsync() doesn't guarantee durability past power
    // failures. fcntl(F_FULLFSYNC) is required for that purpose. Some
    // filesystems don't support fcntl(F_FULLFSYNC), and require a fallback to
    // fsync().
    if (::fcntl(fd, F_FULLFSYNC) == 0) {
      return Status::OK();
    }
#endif  // HAVE_FULLFSYNC

#if HAVE_FDATASYNC
    bool sync_success = ::fdatasync(fd) == 0;
#else
    bool sync_success = ::fsync(fd) == 0;
#endif  // HAVE_FDATASYNC

    if (sync_success) {
      return Status::OK();
    }
    // Do not crash if filesystem can't fsync directories
    // (see https://github.com/bitcoin/bitcoin/pull/10000)
    if (syncing_dir && errno == EINVAL) {
      return Status::OK();
    }
    return PosixError(fd_path, errno);
  }